

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

void __thiscall
CServerBrowserFavorites::Init
          (CServerBrowserFavorites *this,CNetClient *pNetClient,IConsole *pConsole,IEngine *pEngine,
          IConfigManager *pConfigManager)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long *in_R8;
  
  *(undefined8 *)(in_RDI + 0xbce0) = in_RSI;
  uVar1 = (**(code **)(*in_R8 + 0x30))();
  *(undefined8 *)(in_RDI + 0xbce8) = uVar1;
  *(undefined8 *)(in_RDI + 0xbcf0) = in_RDX;
  *(undefined8 *)(in_RDI + 0xbcf8) = in_RCX;
  if (in_R8 != (long *)0x0) {
    (**(code **)(*in_R8 + 0x38))(in_R8,ConfigSaveCallback,in_RDI);
  }
  (**(code **)(**(long **)(in_RDI + 0xbcf0) + 0x40))
            (*(long **)(in_RDI + 0xbcf0),"add_favorite","s[hostname] ?s[password]",2,ConAddFavorite,
             in_RDI,
             "Add a server (optionally with password) as a favorite. Also updates password of existing favorite."
            );
  (**(code **)(**(long **)(in_RDI + 0xbcf0) + 0x40))
            (*(long **)(in_RDI + 0xbcf0),"remove_favorite","s[hostname]",2,ConRemoveFavorite,in_RDI,
             "Remove a server from favorites");
  return;
}

Assistant:

void CServerBrowserFavorites::Init(CNetClient *pNetClient, IConsole *pConsole, IEngine *pEngine, IConfigManager *pConfigManager)
{
	m_pNetClient = pNetClient;
	m_pConfig = pConfigManager->Values();
	m_pConsole = pConsole;
	m_pEngine = pEngine;
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	m_pConsole->Register("add_favorite", "s[hostname] ?s[password]", CFGFLAG_CLIENT, ConAddFavorite, this, "Add a server (optionally with password) as a favorite. Also updates password of existing favorite.");
	m_pConsole->Register("remove_favorite", "s[hostname]", CFGFLAG_CLIENT, ConRemoveFavorite, this, "Remove a server from favorites");
}